

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O0

void __thiscall ItemTable::BlueRoomTwo(ItemTable *this)

{
  ItemWrapper *pIVar1;
  ItemWrapper *pIVar2;
  mapped_type *ppIVar3;
  key_type local_130 [3];
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  Item local_100;
  ItemWrapper *local_d8;
  ItemWrapper *Glpyhs;
  string local_c8 [32];
  Item local_a8;
  ItemWrapper *local_80;
  ItemWrapper *Ceiling;
  allocator local_61;
  string local_60 [32];
  Item local_40;
  ItemWrapper *local_18;
  ItemWrapper *BabbleFish;
  ItemTable *this_local;
  
  BabbleFish = (ItemWrapper *)this;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  Ceiling._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"BabbleFish",&local_61);
  Item::Item(&local_40,(string *)local_60,FISH);
  ItemWrapper::ItemWrapper(pIVar1,&local_40,HIDDEN);
  Ceiling._3_1_ = 0;
  Item::~Item(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_18 = pIVar1;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  Glpyhs._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Ceiling",(allocator *)((long)&Glpyhs + 7));
  Item::Item(&local_a8,(string *)local_c8,CEILING);
  ItemWrapper::ItemWrapper(pIVar1,&local_a8,B_ROOM2);
  Glpyhs._6_1_ = 0;
  Item::~Item(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Glpyhs + 7));
  local_80 = pIVar1;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  local_122 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"Glyphs",&local_121);
  Item::Item(&local_100,(string *)local_120,GLYPHS);
  ItemWrapper::ItemWrapper(pIVar2,&local_100,B_ROOM2);
  local_122 = 0;
  Item::~Item(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  pIVar1 = local_18;
  local_130[2] = 0x1a;
  local_d8 = pIVar2;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_130 + 2);
  pIVar2 = local_80;
  *ppIVar3 = pIVar1;
  local_130[1] = 0x1b;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_130 + 1);
  pIVar1 = local_d8;
  *ppIVar3 = pIVar2;
  local_130[0] = GLYPHS;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_130);
  *ppIVar3 = pIVar1;
  return;
}

Assistant:

void ItemTable::BlueRoomTwo() {

    ItemWrapper * BabbleFish    = new ItemWrapper(Item("BabbleFish", FISH), HIDDEN);
    ItemWrapper * Ceiling       = new ItemWrapper(Item("Ceiling", CEILING), B_ROOM2);
    ItemWrapper * Glpyhs        = new ItemWrapper(Item("Glyphs", GLYPHS), B_ROOM2);

    items[FISH] = BabbleFish;
    items[CEILING] = Ceiling;
    items[GLYPHS] = Glpyhs;
}